

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

int __thiscall
asl::Dic<asl::String>::clone
          (Dic<asl::String> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  Dic<asl::String> b;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> local_10;
  
  local_10._a = *(KeyVal **)__fn;
  LOCK();
  piVar1 = (int *)((long)&local_10._a[-1].value.field_2 + 8);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::dup(&local_10,(int)__fn);
  (this->super_Map<asl::String,_asl::String>).a._a = local_10._a;
  LOCK();
  piVar1 = (int *)((long)&local_10._a[-1].value.field_2 + 8);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array(&local_10);
  return (int)this;
}

Assistant:

Dic& dup() {this->a.dup(); return *this;}